

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::Edits::Iterator::toString(Iterator *this,UnicodeString *sb)

{
  UnicodeString *pUVar1;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58;
  ConstChar16Ptr local_50;
  ConstChar16Ptr local_48;
  ConstChar16Ptr local_40;
  ConstChar16Ptr local_38 [3];
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *sb_local;
  Iterator *this_local;
  
  local_18 = sb;
  sb_local = (UnicodeString *)this;
  ConstChar16Ptr::ConstChar16Ptr(&local_20,L"{ src[");
  UnicodeString::append(sb,&local_20,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  ICU_Utility::appendNumber(local_18,this->srcIndex,10,1);
  pUVar1 = local_18;
  ConstChar16Ptr::ConstChar16Ptr(local_38,L"..");
  UnicodeString::append(pUVar1,local_38,-1);
  ConstChar16Ptr::~ConstChar16Ptr(local_38);
  ICU_Utility::appendNumber(local_18,this->srcIndex + this->oldLength_,10,1);
  pUVar1 = local_18;
  if (this->changed == '\0') {
    ConstChar16Ptr::ConstChar16Ptr(&local_48,L"] ≡ dest[");
    UnicodeString::append(pUVar1,&local_48,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(&local_40,L"] ⇝ dest[");
    UnicodeString::append(pUVar1,&local_40,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_40);
  }
  ICU_Utility::appendNumber(local_18,this->destIndex,10,1);
  pUVar1 = local_18;
  ConstChar16Ptr::ConstChar16Ptr(&local_50,L"..");
  UnicodeString::append(pUVar1,&local_50,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_50);
  ICU_Utility::appendNumber(local_18,this->destIndex + this->newLength_,10,1);
  pUVar1 = local_18;
  if (this->changed == '\0') {
    ConstChar16Ptr::ConstChar16Ptr(&local_70,L"] (no-change) }");
    UnicodeString::append(pUVar1,&local_70,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_70);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(&local_58,L"], repl[");
    UnicodeString::append(pUVar1,&local_58,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_58);
    ICU_Utility::appendNumber(local_18,this->replIndex,10,1);
    pUVar1 = local_18;
    ConstChar16Ptr::ConstChar16Ptr(&local_60,L"..");
    UnicodeString::append(pUVar1,&local_60,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_60);
    ICU_Utility::appendNumber(local_18,this->replIndex + this->newLength_,10,1);
    pUVar1 = local_18;
    ConstChar16Ptr::ConstChar16Ptr(&local_68,L"] }");
    UnicodeString::append(pUVar1,&local_68,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  }
  return local_18;
}

Assistant:

UnicodeString& Edits::Iterator::toString(UnicodeString& sb) const {
    sb.append(u"{ src[", -1);
    ICU_Utility::appendNumber(sb, srcIndex);
    sb.append(u"..", -1);
    ICU_Utility::appendNumber(sb, srcIndex + oldLength_);
    if (changed) {
        sb.append(u"] ⇝ dest[", -1);
    } else {
        sb.append(u"] ≡ dest[", -1);
    }
    ICU_Utility::appendNumber(sb, destIndex);
    sb.append(u"..", -1);
    ICU_Utility::appendNumber(sb, destIndex + newLength_);
    if (changed) {
        sb.append(u"], repl[", -1);
        ICU_Utility::appendNumber(sb, replIndex);
        sb.append(u"..", -1);
        ICU_Utility::appendNumber(sb, replIndex + newLength_);
        sb.append(u"] }", -1);
    } else {
        sb.append(u"] (no-change) }", -1);
    }
    return sb;
}